

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cpp
# Opt level: O1

int repair_main(int argc,char **argv)

{
  Status SVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  bool bVar6;
  Status status;
  string path;
  ZlibCompressor zlib;
  ZlibCompressorRaw zlib_raw;
  Options options;
  Status local_910;
  string local_908;
  string local_8e8;
  Compressor local_8c8;
  undefined1 local_8a8;
  Compressor local_8a0;
  undefined1 local_880;
  Options local_878;
  
  if ((argc < 3) || (iVar2 = strcmp("help",argv[1]), iVar2 == 0)) {
    printf("Usage: %s repair <minecraft_world_dir>\n",*argv);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,argv[2],(allocator<char> *)&local_8a0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_878);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_908.field_2._M_allocated_capacity = *psVar4;
    local_908.field_2._8_8_ = plVar3[3];
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  }
  else {
    local_908.field_2._M_allocated_capacity = *psVar4;
    local_908._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_908._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_878.comparator != (Comparator *)&local_878.env) {
    operator_delete(local_878.comparator,(ulong)((long)&(local_878.env)->_vptr_Env + 1));
  }
  local_8a0.inputBytes = 0;
  local_8a0.compressedBytes = 0;
  local_8a0.uniqueCompressionID = '\x04';
  local_8a0._28_4_ = 0xffffffff;
  local_880 = 1;
  local_8a0._vptr_Compressor = (_func_int **)&PTR__Compressor_001310b0;
  local_8c8.inputBytes = 0;
  local_8c8.compressedBytes = 0;
  local_8c8.uniqueCompressionID = '\x02';
  local_8c8._28_4_ = 0xffffffff;
  local_8a8 = 0;
  local_8c8._vptr_Compressor = (_func_int **)&PTR__Compressor_00131110;
  leveldb::Options::Options(&local_878);
  local_878.compressors[1] = &local_8c8;
  local_910.state_ = (pointer)0x0;
  local_878.compressors[0] = &local_8a0;
  leveldb::RepairDB((leveldb *)&local_8e8,&local_908,&local_878);
  SVar1.state_ = local_910.state_;
  local_910.state_ = local_8e8._M_dataplus._M_p;
  local_8e8._M_dataplus._M_p = SVar1.state_;
  if (SVar1.state_ != (pointer)0x0) {
    operator_delete__(SVar1.state_);
  }
  bVar6 = local_910.state_ != (pointer)0x0;
  if (bVar6) {
    leveldb::Status::ToString_abi_cxx11_(&local_8e8,&local_910);
    repair_main();
  }
  uVar5 = (uint)bVar6;
  if (local_910.state_ != (pointer)0x0) {
    operator_delete__(local_910.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p == &local_908.field_2) {
    return uVar5;
  }
  operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  return uVar5;
}

Assistant:

int repair_main(int argc, char *argv[]) {
    if(argc < 3 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s repair <minecraft_world_dir>\n", argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    leveldb::ZlibCompressorRaw zlib_raw;
    leveldb::ZlibCompressor zlib;

    leveldb::Options options;
    options.compressors[0] = &zlib_raw;
    options.compressors[1] = &zlib;

    leveldb::Status status;
    status = leveldb::RepairDB(path, options);

    if(!status.ok()) {
        fprintf(stderr, "ERROR: Repairing '%s' failed --- %s\n", path.c_str(),
                status.ToString().c_str());
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}